

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O0

bool tinyusdz::detail::ParseMaterialXValue<std::__cxx11::string>
               (string *str,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value
               ,string *err)

{
  uint8_t *binary;
  uint64_t length;
  bool bVar1;
  undefined1 local_530 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  AsciiParser parser;
  StreamReader sr;
  string *err_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  string *str_local;
  
  binary = (uint8_t *)::std::__cxx11::string::data();
  length = ::std::__cxx11::string::size();
  StreamReader::StreamReader((StreamReader *)&parser._primspec_fun._M_invoker,binary,length,false);
  ascii::AsciiParser::AsciiParser
            ((AsciiParser *)((long)&val.field_2 + 8),
             (StreamReader *)&parser._primspec_fun._M_invoker);
  ::std::__cxx11::string::string((string *)local_530);
  bVar1 = ParseValue<std::__cxx11::string>
                    ((AsciiParser *)((long)&val.field_2 + 8),(string *)local_530,err);
  if (bVar1) {
    ::std::__cxx11::string::operator=((string *)value,(string *)local_530);
  }
  ::std::__cxx11::string::~string((string *)local_530);
  ascii::AsciiParser::~AsciiParser((AsciiParser *)((long)&val.field_2 + 8));
  return bVar1;
}

Assistant:

bool ParseMaterialXValue(const std::string &str, T *value, std::string *err) {
  tinyusdz::StreamReader sr(reinterpret_cast<const uint8_t *>(str.data()),
                            str.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

  T val{};

  if (!ParseValue(parser, val, err)) {
    return false;
  }

  (*value) = val;
  return true;
}